

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::dfsForRandomIterative(Graph *this)

{
  ulong uVar1;
  _Map_pointer ppNVar2;
  ulong *puVar3;
  pointer pvVar4;
  uint64_t uVar5;
  pointer pEVar6;
  pointer puVar7;
  _Map_pointer ppNVar8;
  _Map_pointer ppNVar9;
  uint64_t *puVar10;
  _Map_pointer ppNVar11;
  result_type_conflict rVar12;
  void *pvVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long *plVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  Node *pNVar21;
  _Map_pointer ppNVar22;
  uint64_t *local_150;
  long *local_148;
  long *local_140;
  void *local_138;
  uint64_t *local_130;
  ulong local_128;
  uint64_t *local_120;
  void *local_118;
  ulong local_110;
  uint64_t *local_f8;
  long *plStack_f0;
  uint64_t *local_e8;
  uint64_t *puStack_e0;
  uint64_t *local_d8;
  long *plStack_d0;
  uint64_t *local_c0;
  value_type local_98;
  ulong local_88;
  stack<Node,_std::deque<Node,_std::allocator<Node>_>_> local_80;
  
  local_110 = 8;
  local_118 = operator_new(0x40);
  puVar10 = (uint64_t *)operator_new(0x200);
  plStack_f0 = (long *)((long)local_118 + 0x18);
  *(uint64_t **)((long)local_118 + 0x18) = puVar10;
  local_f8 = puVar10 + 0x40;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 8;
  ppNVar11 = (_Map_pointer)operator_new(0x40);
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_map =
       ppNVar11;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)operator_new(0x200);
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = ppNVar11 + 3;
  ppNVar11[3] = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur + 0x20;
  local_98.vertex = 0;
  local_98.start = 0;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_node = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push(&local_80,&local_98);
  *(this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
   super__Vector_impl_data._M_start = Grey;
  pNVar21 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_start._M_cur;
  local_e8 = puVar10;
  puStack_e0 = puVar10;
  local_d8 = local_f8;
  plStack_d0 = plStack_f0;
  local_130 = puVar10;
  local_120 = puVar10;
  local_148 = plStack_f0;
  ppNVar11 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_map;
  ppNVar8 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_node;
  if (local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    do {
      ppNVar9 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur ==
          local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first) {
        ppNVar11 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node + -1;
        uVar20 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1][0x1f].vertex;
        uVar16 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1][0x1f].start;
        operator_delete(local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_first,0x200);
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first = ppNVar9[-1];
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_last =
             local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + 0x20;
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur =
             local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + 0x1f;
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node = ppNVar11;
      }
      else {
        uVar20 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur[-1].vertex;
        uVar16 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur[-1].start;
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur =
             local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur + -1;
      }
      local_130 = local_e8;
      local_150 = local_d8;
      local_148 = plStack_d0;
      local_120 = puStack_e0;
      local_c0 = local_f8;
      local_138 = local_118;
      local_128 = local_110;
      pvVar4 = (this->matrix).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = *(long *)&pvVar4[uVar20].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      if (uVar16 < (ulong)((long)*(pointer *)
                                  ((long)&pvVar4[uVar20].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl + 8) - lVar17 >> 3)) {
        local_140 = plStack_f0;
        uVar19 = uVar20;
        do {
          uVar5 = *(uint64_t *)(lVar17 + uVar16 * 8);
          pEVar6 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar20 = pEVar6[uVar5].super_LightEdge.u;
          if (uVar20 == uVar19) {
            uVar20 = pEVar6[uVar5].super_LightEdge.v;
          }
          if (pEVar6[uVar5].finished == true) {
LAB_00103b9a:
            uVar16 = uVar16 + 1;
            uVar20 = uVar19;
          }
          else {
            pEVar6[uVar5].finished = true;
            if ((this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar20] != White) {
              rVar12 = std::uniform_int_distribution<unsigned_long>::operator()
                                 (&rand,&engine,&rand._M_param);
              pEVar6[uVar5].shift = rVar12;
              puVar7 = (this->sums).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar3 = puVar7 + uVar20;
              *puVar3 = *puVar3 ^ rVar12;
              puVar3 = puVar7 + uVar19;
              *puVar3 = *puVar3 ^ pEVar6[uVar5].shift;
              goto LAB_00103b9a;
            }
            if (local_130 == local_150 + -2) {
              lVar17 = (long)local_148 - (long)local_140 >> 3;
              if (((long)local_c0 - (long)puVar10 >> 4) + ((long)local_130 - (long)local_120 >> 4) +
                  (lVar17 + -1 + (ulong)(local_148 == (long *)0x0)) * 0x20 == 0x7ffffffffffffff) {
                std::__throw_length_error("cannot create std::deque larger than max_size()");
              }
              if (local_128 - ((long)local_148 - (long)local_138 >> 3) < 2) {
                if (lVar17 * 2 + 4U < local_128) {
                  plVar18 = (long *)((long)local_138 +
                                    (local_128 - (lVar17 + 2) & 0xfffffffffffffffe) * 4);
                  if (plVar18 < local_140) {
                    sVar14 = (long)local_148 + (8 - (long)local_140);
                    if (sVar14 != 0) {
                      memmove(plVar18,local_140,sVar14);
                    }
                  }
                  else {
                    sVar14 = (long)local_148 + (8 - (long)local_140);
                    if (sVar14 != 0) {
                      memmove((void *)((long)plVar18 + ((lVar17 + 1) * 8 - sVar14)),local_140,sVar14
                             );
                    }
                  }
                }
                else {
                  lVar15 = local_128 * 2 + (ulong)(local_128 == 0);
                  uVar1 = lVar15 + 2;
                  if (uVar1 >> 0x3c != 0) {
                    if (uVar1 >> 0x3d != 0) {
                      std::__throw_bad_array_new_length();
                    }
                    std::__throw_bad_alloc();
                  }
                  local_88 = uVar1;
                  pvVar13 = operator_new(uVar1 * 8);
                  plVar18 = (long *)((long)pvVar13 + (lVar15 - lVar17 & 0xfffffffffffffffeU) * 4);
                  sVar14 = (long)local_148 + (8 - (long)local_140);
                  if (sVar14 != 0) {
                    memmove(plVar18,local_140,sVar14);
                  }
                  operator_delete(local_138,local_128 << 3);
                  local_128 = local_88;
                  local_138 = pvVar13;
                }
                local_c0 = (uint64_t *)(*plVar18 + 0x200);
                local_148 = plVar18 + lVar17;
                local_140 = plVar18;
              }
              local_120 = (uint64_t *)operator_new(0x200);
              local_148[1] = (long)local_120;
              local_148 = local_148 + 1;
              *local_130 = uVar20;
              local_130[1] = uVar5;
              local_150 = local_120 + 0x40;
              local_130 = local_120;
            }
            else {
              *local_130 = uVar20;
              local_130[1] = uVar5;
              local_130 = local_130 + 2;
            }
            local_98.start = uVar16 + 1;
            local_98.vertex = uVar19;
            std::stack<Node,_std::deque<Node,_std::allocator<Node>_>_>::push(&local_80,&local_98);
            (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar20] = Grey;
            uVar16 = 0;
          }
          pvVar4 = (this->matrix).
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar17 = *(long *)&pvVar4[uVar20].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl;
          plStack_f0 = local_140;
          uVar19 = uVar20;
          pNVar21 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur;
        } while (uVar16 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar4[uVar20].
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl + 8) - lVar17 >> 3));
      }
      local_e8 = local_130;
      local_d8 = local_150;
      plStack_d0 = local_148;
      puStack_e0 = local_120;
      local_f8 = local_c0;
      local_110 = local_128;
      local_118 = local_138;
      (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
      super__Vector_impl_data._M_start[uVar20] = Black;
      ppNVar11 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_map;
      ppNVar8 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
    } while (local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != pNVar21);
  }
  while (local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
         _M_map = ppNVar11,
        local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_node = ppNVar8, local_130 != puVar10) {
    if (local_130 == local_120) {
      plVar18 = local_148 + -1;
      uVar20 = *(uint64_t *)(local_148[-1] + 0x1f0);
      uVar19 = *(uint64_t *)(local_148[-1] + 0x1f8);
      operator_delete(local_120,0x200);
      local_120 = (uint64_t *)local_148[-1];
      local_130 = local_120 + 0x3e;
      plStack_d0 = plVar18;
    }
    else {
      uVar20 = local_130[-2];
      uVar19 = local_130[-1];
      local_130 = local_130 + -2;
      plVar18 = local_148;
    }
    pEVar6 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (this->sums).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = puVar7[uVar20];
    pEVar6[uVar19].shift = uVar16;
    puVar7[pEVar6[uVar19].super_LightEdge.v] = puVar7[pEVar6[uVar19].super_LightEdge.v] ^ uVar16;
    puVar7[pEVar6[uVar19].super_LightEdge.u] =
         puVar7[pEVar6[uVar19].super_LightEdge.u] ^ pEVar6[uVar19].shift;
    local_148 = plVar18;
    ppNVar11 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
               super__Deque_impl_data._M_map;
    ppNVar8 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
  }
  if (ppNVar11 != (_Map_pointer)0x0) {
    if (local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.super__Deque_impl_data.
        _M_start._M_node < ppNVar8 + 1) {
      ppNVar22 = local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node + -1;
      do {
        ppNVar2 = ppNVar22 + 1;
        ppNVar22 = ppNVar22 + 1;
        operator_delete(*ppNVar2,0x200);
      } while (ppNVar22 < ppNVar8);
    }
    operator_delete(ppNVar11,local_80.c.super__Deque_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Deque_impl_data._M_map_size << 3);
  }
  if (local_118 == (void *)0x0) {
    return;
  }
  if (plStack_f0 < plStack_d0 + 1) {
    plStack_f0 = (long *)((long)plStack_f0 + 0xfffffffffffffff8);
    do {
      plVar18 = plStack_f0 + 1;
      plStack_f0 = plStack_f0 + 1;
      operator_delete((void *)*plVar18,0x200);
    } while (plStack_f0 < plStack_d0);
  }
  operator_delete(local_118,local_110 << 3);
  return;
}

Assistant:

void Graph::dfsForRandomIterative() {
    struct Node {
        std::uint64_t vertex;
        std::uint64_t start;
    };

    struct Tree {
        std::uint64_t vertex;
        std::uint64_t edge;
    };

    std::stack<Tree> ostov;
    std::stack<Node> stack;
    stack.push({0, 0});

    colorMap[0] = Colors::Grey;
    while (!stack.empty()) {
        std::uint64_t u = stack.top().vertex;
        std::uint64_t i = stack.top().start;
        stack.pop();

        while (i < matrix[u].size()) {
            auto &e = edges[matrix[u][i]];
            std::uint64_t v = ((e.u != u) ? e.u : e.v);

            if (e.finished) {
                ++i;
                continue;
            }

            e.finished = true;
            if (colorMap[v] == Colors::White) {
                ostov.push({v, matrix[u][i]});
                stack.push({u, i + 1});

                u = v;
                colorMap[u] = Colors::Grey;
                i = 0;
            } else {
                e.shift = rand(engine);
                sums[v] ^= e.shift;
                sums[u] ^= e.shift;
                ++i;
            }
        }

        colorMap[u] = Colors::Black;
    }

    while (!ostov.empty()) {
        std::uint64_t u = ostov.top().vertex;
        std::uint64_t i = ostov.top().edge;
        ostov.pop();

        auto &e = edges[i];
        e.shift = sums[u];
        sums[e.v] ^= e.shift;
        sums[e.u] ^= e.shift;
    }
}